

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NormalizerValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)607>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar2;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_8d;
  TypeCase local_8c;
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_88;
  undefined1 local_70 [40];
  Result result;
  
  puVar2 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar2 == (ModelDescription *)0x0) {
    puVar2 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  local_88._M_impl.super__Vector_impl_data._M_start._0_1_ = false;
  local_88._M_impl.super__Vector_impl_data._M_start._1_1_ = false;
  local_88._M_impl.super__Vector_impl_data._M_start._2_1_ = false;
  local_88._M_impl.super__Vector_impl_data._M_start._3_1_ = false;
  validateModelDescription
            ((Result *)local_70,(ModelDescription *)puVar2,format->specificationversion_,
             (ValidationPolicy *)&local_88);
  Result::operator=(&result,(Result *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_8c = kMultiArrayType;
    __l._M_len = 1;
    __l._M_array = &local_8c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_88,__l,&local_8d);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_70,(CoreML *)&((ModelDescription *)puVar2)->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_88,
               in_R8);
    Result::operator=(&result,(Result *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_88);
    bVar1 = Result::good(&result);
    if (bVar1) {
      local_8c = kMultiArrayType;
      __l_00._M_len = 1;
      __l_00._M_array = &local_8c;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)&local_88,__l_00,&local_8d);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_70,(CoreML *)&((ModelDescription *)puVar2)->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_88,
                 in_R8);
      Result::operator=(&result,(Result *)local_70);
      std::__cxx11::string::~string((string *)(local_70 + 8));
      std::
      _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~_Vector_base(&local_88);
      bVar1 = Result::good(&result);
      if (bVar1) {
        if (format->_oneof_case_[0] == 0x25f) {
          puVar2 = (undefined1 *)(format->Type_).supportvectorclassifier_;
        }
        else {
          puVar2 = Specification::_Normalizer_default_instance_;
        }
        if (2 < (uint)(((SupportVectorClassifier *)puVar2)->numberofsupportvectorsperclass_).
                      current_size_) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_70,"NormalizerValidator normLx invalid",
                     (allocator<char> *)&local_88);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
          std::__cxx11::string::~string((string *)local_70);
          goto LAB_002840dd;
        }
      }
    }
  }
  Result::Result(__return_storage_ptr__,&result);
LAB_002840dd:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_normalizer>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        auto normLx = format.normalizer().normtype();
        if (normLx != Specification::Normalizer_NormType::Normalizer_NormType_L1 &&
            normLx != Specification::Normalizer_NormType::Normalizer_NormType_L2 &&
            normLx != Specification::Normalizer_NormType::Normalizer_NormType_LMax) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "NormalizerValidator normLx invalid");
        }
        
        return result;
    }